

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.h
# Opt level: O2

void __thiscall IntegerRandomGenerator::~IntegerRandomGenerator(IntegerRandomGenerator *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->mValues).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

IntegerRandomGenerator(std::vector<double> distribution, std::vector<int> values)
    {
        size_t size_dist = distribution.size();
        size_t size_val  = values.size();
        if( size_dist != size_val )
        {
            throw std::invalid_argument("distribution and values vectors shall have the same length");
        }
        else
        {
            for( double p_i : distribution )
            {
                mDist.push_back(p_i);
            }
            for( int x_i : values )
            {
                mValues.push_back(x_i);
            }
        }
    }